

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeOverwriteContent(MemPage *pPage,u8 *pDest,BtreePayload *pX,int iOffset,int iAmt)

{
  bool bVar1;
  int iVar2;
  int unaff_R12D;
  uint uVar3;
  ulong uVar4;
  
  iVar2 = pX->nData;
  uVar3 = iVar2 - iOffset;
  if (uVar3 == 0 || iVar2 < iOffset) {
    bVar1 = true;
    if (0 < iAmt) {
      uVar4 = 0;
      do {
        if (pDest[uVar4] != '\0') {
          unaff_R12D = sqlite3PagerWrite(pPage->pDbPage);
          if (unaff_R12D == 0) {
            memset(pDest + uVar4,0,(long)iAmt - uVar4);
          }
          else {
            bVar1 = false;
          }
          break;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)iAmt != uVar4);
    }
    if (!bVar1) {
      return unaff_R12D;
    }
  }
  else {
    if ((iAmt - uVar3 != 0 && (int)uVar3 <= iAmt) &&
       (iVar2 = btreeOverwriteContent(pPage,pDest + uVar3,pX,iVar2,iAmt - uVar3), iAmt = uVar3,
       iVar2 != 0)) {
      return iVar2;
    }
    iVar2 = bcmp(pDest,(void *)((long)pX->pData + (long)iOffset),(long)iAmt);
    if (iVar2 != 0) {
      iVar2 = sqlite3PagerWrite(pPage->pDbPage);
      if (iVar2 != 0) {
        return iVar2;
      }
      memcpy(pDest,(void *)((long)iOffset + (long)pX->pData),(long)iAmt);
    }
  }
  return 0;
}

Assistant:

static int btreeOverwriteContent(
  MemPage *pPage,           /* MemPage on which writing will occur */
  u8 *pDest,                /* Pointer to the place to start writing */
  const BtreePayload *pX,   /* Source of data to write */
  int iOffset,              /* Offset of first byte to write */
  int iAmt                  /* Number of bytes to be written */
){
  int nData = pX->nData - iOffset;
  if( nData<=0 ){
    /* Overwritting with zeros */
    int i;
    for(i=0; i<iAmt && pDest[i]==0; i++){}
    if( i<iAmt ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      memset(pDest + i, 0, iAmt - i);
    }
  }else{
    if( nData<iAmt ){
      /* Mixed read data and zeros at the end.  Make a recursive call
      ** to write the zeros then fall through to write the real data */
      int rc = btreeOverwriteContent(pPage, pDest+nData, pX, iOffset+nData,
                                 iAmt-nData);
      if( rc ) return rc;
      iAmt = nData;
    }
    if( memcmp(pDest, ((u8*)pX->pData) + iOffset, iAmt)!=0 ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      memcpy(pDest, ((u8*)pX->pData) + iOffset, iAmt);
    }
  }
  return SQLITE_OK;
}